

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttf.c
# Opt level: O2

void cache_glyph(ALLEGRO_TTF_FONT_DATA *font_data,FT_Face_conflict face,int ft_index,
                ALLEGRO_TTF_GLYPH_DATA *glyph,_Bool lock_whole_page)

{
  uchar uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  char cVar6;
  int iVar7;
  uchar *puVar8;
  FT_GlyphSlot_conflict pFVar9;
  long lVar10;
  byte *pbVar11;
  long lVar12;
  long lVar13;
  byte bVar14;
  byte bVar15;
  undefined1 auVar16 [16];
  
  if ((glyph->page_bitmap == (ALLEGRO_BITMAP *)0x0) && (-1 < (glyph->region).x)) {
    iVar7 = FT_Load_Glyph(face,ft_index,
                          (font_data->flags & 2U) * 0x10000 + (font_data->flags & 4U) * 0x2000 + 0xc
                         );
    if (iVar7 != 0) {
      cVar6 = _al_trace_prefix("font",2,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/ttf/ttf.c"
                               ,0x1af);
      if (cVar6 != '\0') {
        _al_trace_suffix("Failed loading glyph %d from.\n",ft_index);
      }
    }
    pFVar9 = face->glyph;
    glyph->offset_x = (short)pFVar9->bitmap_left;
    glyph->offset_y = (short)((uint)(face->size->metrics).ascender >> 6) - (short)pFVar9->bitmap_top
    ;
    glyph->advance = (short)((uint)(pFVar9->advance).x >> 6);
    uVar3 = (pFVar9->bitmap).rows;
    uVar4 = (pFVar9->bitmap).width;
    if (uVar3 == 0 || uVar4 == 0) {
      (glyph->region).x = -1;
      (glyph->region).y = -1;
      cVar6 = _al_trace_prefix("font",0,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/ttf/ttf.c"
                               ,0x1bd,"cache_glyph");
      if (cVar6 != '\0') {
        _al_trace_suffix("Glyph %d has zero size.\n",ft_index);
        return;
      }
    }
    else {
      puVar8 = alloc_glyph_region(font_data,ft_index,uVar4 + 2,uVar3 + 2,false,glyph,lock_whole_page
                                 );
      if (puVar8 != (uchar *)0x0) {
        iVar7 = font_data->page_lr->pitch;
        pFVar9 = face->glyph;
        if ((font_data->flags & 2) == 0) {
          for (lVar10 = 0; lVar10 < (int)(pFVar9->bitmap).rows; lVar10 = lVar10 + 1) {
            puVar5 = (pFVar9->bitmap).buffer;
            lVar12 = (long)(pFVar9->bitmap).pitch;
            if ((font_data->flags & 0x200) == 0) {
              for (lVar13 = 0; (int)lVar13 < (int)(pFVar9->bitmap).width; lVar13 = lVar13 + 1) {
                uVar1 = puVar5[lVar13 + lVar12 * lVar10];
                auVar16 = ZEXT216(CONCAT11(uVar1,uVar1));
                auVar16 = pshuflw(auVar16,auVar16,0);
                *(int *)(puVar8 + lVar13 * 4) = auVar16._0_4_;
                pFVar9 = face->glyph;
              }
            }
            else {
              for (lVar13 = 0; (int)lVar13 < (int)(pFVar9->bitmap).width; lVar13 = lVar13 + 1) {
                uVar1 = puVar5[lVar13 + lVar12 * lVar10];
                (puVar8 + lVar13 * 4)[0] = 0xff;
                (puVar8 + lVar13 * 4)[1] = 0xff;
                puVar8[lVar13 * 4 + 2] = 0xff;
                puVar8[lVar13 * 4 + 3] = uVar1;
                pFVar9 = face->glyph;
              }
            }
            puVar8 = puVar8 + iVar7;
          }
        }
        else {
          for (lVar10 = 0; lVar10 < (int)(pFVar9->bitmap).rows; lVar10 = lVar10 + 1) {
            pbVar11 = (pFVar9->bitmap).buffer + (pFVar9->bitmap).pitch * lVar10;
            if ((font_data->flags & 0x200) == 0) {
              bVar14 = 0;
              for (lVar12 = 0; (int)lVar12 < (int)(pFVar9->bitmap).width; lVar12 = lVar12 + 1) {
                bVar2 = *pbVar11;
                bVar15 = bVar14 ^ 7;
                bVar14 = bVar14 + 1 & 7;
                pbVar11 = pbVar11 + (bVar14 == 0);
                *(uint *)(puVar8 + lVar12 * 4) =
                     (-(uint)((bVar2 >> bVar15 & 1) != 0) & 0xff) * 0x1010101;
                pFVar9 = face->glyph;
              }
            }
            else {
              bVar14 = 0;
              for (lVar12 = 0; (int)lVar12 < (int)(pFVar9->bitmap).width; lVar12 = lVar12 + 1) {
                bVar2 = *pbVar11;
                (puVar8 + lVar12 * 4)[0] = 0xff;
                (puVar8 + lVar12 * 4)[1] = 0xff;
                puVar8[lVar12 * 4 + 2] = 0xff;
                puVar8[lVar12 * 4 + 3] = -((bVar2 >> (bVar14 ^ 7) & 1) != 0);
                bVar14 = bVar14 + 1 & 7;
                pbVar11 = pbVar11 + (bVar14 == 0);
                pFVar9 = face->glyph;
              }
            }
            puVar8 = puVar8 + iVar7;
          }
        }
        if (!lock_whole_page) {
          unlock_current_page(font_data);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

static void cache_glyph(ALLEGRO_TTF_FONT_DATA *font_data, FT_Face face,
   int ft_index, ALLEGRO_TTF_GLYPH_DATA *glyph, bool lock_whole_page)
{
    FT_Int32 ft_load_flags;
    FT_Error e;
    int w, h;
    unsigned char *glyph_data;

    if (glyph->page_bitmap || glyph->region.x < 0)
        return;
   
    /* We shouldn't ever get here, as cache misses
     * should have been set to ft_index = 0. */
    ASSERT(!(font_data->skip_cache_misses && !lock_whole_page));

    // FIXME: make this a config setting? FT_LOAD_FORCE_AUTOHINT

    // FIXME: Investigate why some fonts don't work without the
    // NO_BITMAP flags. Supposedly using that flag makes small sizes
    // look bad so ideally we would not used it.
    ft_load_flags = FT_LOAD_RENDER | FT_LOAD_NO_BITMAP;
    if (font_data->flags & ALLEGRO_TTF_MONOCHROME)
       ft_load_flags |= FT_LOAD_TARGET_MONO;
    if (font_data->flags & ALLEGRO_TTF_NO_AUTOHINT)
       ft_load_flags |= FT_LOAD_NO_AUTOHINT;

    e = FT_Load_Glyph(face, ft_index, ft_load_flags);
    if (e) {
       ALLEGRO_WARN("Failed loading glyph %d from.\n", ft_index);
    }

    glyph->offset_x = face->glyph->bitmap_left;
    glyph->offset_y = (face->size->metrics.ascender >> 6) - face->glyph->bitmap_top;
    glyph->advance = face->glyph->advance.x >> 6;

    w = face->glyph->bitmap.width;
    h = face->glyph->bitmap.rows;

    if (w == 0 || h == 0) {
       /* Mark this glyph so we won't try to cache it next time. */
       glyph->region.x = -1;
       glyph->region.y = -1;
       ALLEGRO_DEBUG("Glyph %d has zero size.\n", ft_index);
       return;
    }

    /* Each glyph has a 1-pixel border all around. Note: The border is kept
     * even against the outer bitmap edge, to ensure consistent rendering.
     */
    glyph_data = alloc_glyph_region(font_data, ft_index,
       w + 2, h + 2, false, glyph, lock_whole_page);

    if (glyph_data == NULL) {
       return;
    }

    if (font_data->flags & ALLEGRO_TTF_MONOCHROME)
       copy_glyph_mono(font_data, face, glyph_data);
    else
       copy_glyph_color(font_data, face, glyph_data);

    if (!lock_whole_page) {
       unlock_current_page(font_data);
    }
}